

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeGetUnusedPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int flags)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = btreeGetPage((BtShared *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (Pgno)((ulong)in_RDI >> 0x20),
                       (MemPage **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RDX >> 0x20));
  if (iVar1 == 0) {
    iVar2 = sqlite3PagerPageRefcount((DbPage *)0x16e4b7);
    if (iVar2 < 2) {
      *(undefined1 *)*in_RDX = 0;
    }
    else {
      releasePage((MemPage *)0x16e4c9);
      *in_RDX = 0;
      iVar1 = sqlite3CorruptError(0);
    }
  }
  else {
    *in_RDX = 0;
  }
  return iVar1;
}

Assistant:

static int btreeGetUnusedPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int flags            /* PAGER_GET_NOCONTENT or PAGER_GET_READONLY */
){
  int rc = btreeGetPage(pBt, pgno, ppPage, flags);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  return rc;
}